

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O1

void defyx::generateSuperscalar(SuperscalarProgram *prog,Blake2Generator *gen)

{
  byte bVar1;
  byte bVar2;
  type tVar3;
  pointer pMVar4;
  bool bVar5;
  int cycle;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  int cycle_00;
  SuperscalarInstructionInfo *pSVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  RegisterInfo *pRVar19;
  int iVar20;
  undefined1 *this;
  int topCycle;
  SuperscalarInstruction currentInstruction;
  RegisterInfo registers [8];
  type portBusy [174] [3];
  int local_970;
  uint local_96c;
  ulong local_950;
  int local_948;
  int local_944;
  int local_930;
  int local_92c;
  SuperscalarInstruction local_918;
  SuperscalarInstructionInfo *local_8e8;
  ulong local_8e0;
  RegisterInfo local_8d8 [8];
  type local_858 [522];
  
  lVar12 = 0;
  memset(local_858,0,0x828);
  do {
    *(undefined8 *)((long)&local_8d8[0].latency + lVar12) = 0xffffffff00000000;
    *(undefined8 *)((long)&local_8d8[0].lastOpPar + lVar12) = 0xffffffff;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x80);
  local_918._34_6_ = uRam00000000001261b2;
  local_918._32_2_ = DAT_001261b0;
  local_918.info_ =
       (SuperscalarInstructionInfo *)
       CONCAT44(SuperscalarInstruction::Null._4_4_,(undefined4)SuperscalarInstruction::Null);
  local_918.dst_ = DAT_00126198._4_4_;
  local_918.src_ = (int)DAT_00126198;
  local_918.mod_ = _DAT_001261a0;
  local_918.imm32_ = DAT_001261a0_4;
  local_918.opGroup_ = (SuperscalarInstructionType)uRam00000000001261a8;
  local_918.opGroupPar_ = uRam00000000001261a8._4_4_;
  local_950 = 0;
  this = DecoderBuffer::Default;
  local_944 = 0;
  local_92c = 0;
  iVar10 = 0;
  iVar17 = 0;
  local_970 = 0;
  local_8e0 = 0;
  local_948 = 0;
  local_96c = 0;
  bVar13 = false;
  local_930 = 0;
  do {
    this = (undefined1 *)
           DecoderBuffer::fetchNext
                     ((DecoderBuffer *)this,(local_918.info_)->type_,(int)local_8e0,local_948,gen);
    iVar9 = 0;
    do {
      if (((DecoderBuffer *)this)->opsCount_ <= iVar9) break;
      iVar20 = iVar10;
      if ((int)local_950 <
          (int)((ulong)((long)((local_918.info_)->ops_).
                              super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)((local_918.info_)->ops_).
                             super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 5)) {
LAB_00112d38:
        pSVar14 = local_918.info_;
        iVar18 = (int)local_950;
        pMVar4 = ((local_918.info_)->ops_).
                 super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>._M_impl.
                 super__Vector_impl_data._M_start;
        cycle = iVar17;
        if (iVar17 < iVar10) {
          cycle = iVar10;
        }
        if (pMVar4[iVar18].dependent_ == false) {
          cycle = iVar10;
        }
        iVar7 = pMVar4[iVar18].uop1_;
        if (iVar7 != 0) {
          tVar3 = pMVar4[iVar18].uop2_;
          if (tVar3 == 0) {
            cycle = scheduleUop<false>(iVar7,(type (*) [174] [3])local_858,cycle);
          }
          else if (cycle < 0xae) {
            local_8e8 = local_918.info_;
            iVar11 = cycle;
            do {
              cycle = scheduleUop<false>(iVar7,(type (*) [174] [3])local_858,iVar11);
              iVar6 = scheduleUop<false>(tVar3,(type (*) [174] [3])local_858,iVar11);
              pSVar14 = local_8e8;
              if (cycle == iVar6) goto LAB_00112e1a;
              iVar11 = iVar11 + 1;
            } while (iVar11 != 0xae);
            cycle = -1;
          }
          else {
            cycle = -1;
          }
        }
LAB_00112e1a:
        if (cycle < 0) {
          iVar7 = 6;
          bVar13 = true;
        }
        else {
          if (iVar18 == pSVar14->srcOp_) {
            iVar20 = iVar10 + 4;
            iVar11 = 0;
            do {
              iVar6 = cycle + iVar11;
              bVar5 = SuperscalarInstruction::selectSource(&local_918,iVar6,&local_8d8,gen);
              if (bVar5) {
                iVar20 = iVar10 + iVar11;
                goto LAB_00112ea9;
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 != 4);
            iVar6 = cycle + 4;
            iVar11 = 4;
LAB_00112ea9:
            iVar7 = 0;
            if (iVar11 == 4) {
              if (local_970 < 0x100) {
                local_970 = local_970 + 1;
                local_950 = (ulong)((long)((local_918.info_)->ops_).
                                          super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)((local_918.info_)->ops_).
                                         super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5;
                iVar7 = 5;
              }
              else {
                local_918._32_2_ = DAT_001261b0;
                local_918.mod_ = _DAT_001261a0;
                local_918.imm32_ = DAT_001261a0_4;
                local_918.opGroup_ = (SuperscalarInstructionType)uRam00000000001261a8;
                local_918.opGroupPar_ = uRam00000000001261a8._4_4_;
                local_918.info_ =
                     (SuperscalarInstructionInfo *)
                     CONCAT44(SuperscalarInstruction::Null._4_4_,
                              (undefined4)SuperscalarInstruction::Null);
                local_918.dst_ = DAT_00126198._4_4_;
                local_918.src_ = (int)DAT_00126198;
                iVar7 = 6;
              }
            }
            cycle = iVar6;
            if (iVar11 == 4) goto LAB_001131b0;
          }
          if ((int)local_950 == (local_918.info_)->dstOp_) {
            iVar6 = iVar20 + 4;
            iVar11 = 0;
            do {
              cycle_00 = cycle + iVar11;
              bVar5 = SuperscalarInstruction::selectDestination
                                (&local_918,cycle_00,0 < local_970,&local_8d8,gen);
              if (bVar5) {
                iVar6 = iVar20 + iVar11;
                goto LAB_00112f8f;
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 != 4);
            cycle_00 = cycle + 4;
            iVar11 = 4;
LAB_00112f8f:
            iVar7 = 0;
            if (iVar11 == 4) {
              if (local_970 < 0x100) {
                local_970 = local_970 + 1;
                local_950 = (ulong)((long)((local_918.info_)->ops_).
                                          super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)((local_918.info_)->ops_).
                                         super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5;
                iVar7 = 5;
              }
              else {
                local_918._32_2_ = DAT_001261b0;
                local_918.mod_ = _DAT_001261a0;
                local_918.imm32_ = DAT_001261a0_4;
                local_918.opGroup_ = (SuperscalarInstructionType)uRam00000000001261a8;
                local_918.opGroupPar_ = uRam00000000001261a8._4_4_;
                local_918.info_ =
                     (SuperscalarInstructionInfo *)
                     CONCAT44(SuperscalarInstruction::Null._4_4_,
                              (undefined4)SuperscalarInstruction::Null);
                local_918.dst_ = DAT_00126198._4_4_;
                local_918.src_ = (int)DAT_00126198;
                iVar7 = 6;
              }
            }
            cycle = cycle_00;
            iVar20 = iVar6;
            if (iVar11 == 4) goto LAB_001131b0;
          }
          tVar3 = pMVar4[iVar18].uop1_;
          if (tVar3 != 0) {
            iVar17 = pMVar4[iVar18].uop2_;
            if (iVar17 == 0) {
              cycle = scheduleUop<true>(tVar3,(type (*) [174] [3])local_858,cycle);
            }
            else {
              iVar20 = cycle;
              if (cycle < 0xae) {
                do {
                  cycle = scheduleUop<false>(tVar3,(type (*) [174] [3])local_858,iVar20);
                  iVar7 = scheduleUop<false>(iVar17,(type (*) [174] [3])local_858,iVar20);
                  if (cycle == iVar7) {
                    scheduleUop<true>(tVar3,(type (*) [174] [3])local_858,cycle);
                    scheduleUop<true>(iVar17,(type (*) [174] [3])local_858,iVar7);
                    goto LAB_001130cd;
                  }
                  iVar20 = iVar20 + 1;
                } while (iVar20 != 0xae);
                cycle = -1;
              }
              else {
                cycle = -1;
              }
            }
          }
LAB_001130cd:
          iVar17 = pMVar4[iVar18].latency_ + cycle;
          if ((int)local_950 == (local_918.info_)->resultOp_) {
            local_8d8[local_918.dst_].latency = iVar17;
            local_8d8[local_918.dst_].lastOpGroup = local_918.opGroup_;
            local_8d8[local_918.dst_].lastOpPar = local_918.opGroupPar_;
            local_930 = iVar17;
          }
          local_944 = local_944 + pMVar4[iVar18].size_;
          iVar9 = iVar9 + 1;
          uVar8 = (int)local_950 + 1;
          local_950 = (ulong)uVar8;
          local_92c = local_92c + 1;
          if (0xa9 < cycle) {
            bVar13 = true;
          }
          local_970 = 0;
          if ((int)((ulong)((long)((local_918.info_)->ops_).
                                  super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)((local_918.info_)->ops_).
                                 super__Vector_base<defyx::MacroOp,_std::allocator<defyx::MacroOp>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 5) <= (int)uVar8) {
            lVar12 = (long)(int)local_96c;
            prog->programBuffer[lVar12].opcode = (char)(local_918.info_)->type_;
            prog->programBuffer[lVar12].dst = (uint8_t)local_918.dst_;
            iVar20 = local_918.src_;
            if (local_918.src_ < 0) {
              iVar20 = local_918.dst_;
            }
            prog->programBuffer[lVar12].src = (uint8_t)iVar20;
            prog->programBuffer[lVar12].mod = (uint8_t)local_918.mod_;
            prog->programBuffer[lVar12].imm32 = local_918.imm32_;
            if ((0xd < (uint)(local_918.info_)->type_) ||
               (iVar20 = 1, (0x3808U >> ((local_918.info_)->type_ & 0x1f) & 1) == 0)) {
              iVar20 = 0;
            }
            local_96c = local_96c + 1;
            local_948 = local_948 + iVar20;
          }
          iVar7 = 0;
          iVar20 = iVar10;
        }
      }
      else {
        iVar7 = 6;
        if ((!bVar13) && ((int)local_96c < 0x200)) {
          SuperscalarInstruction::createForSlot
                    (&local_918,gen,((DecoderBuffer *)this)->counts_[iVar9],
                     ((DecoderBuffer *)this)->index_,((DecoderBuffer *)this)->opsCount_ == iVar9 + 1
                     ,iVar9 == 0);
          local_950 = 0;
          goto LAB_00112d38;
        }
      }
LAB_001131b0:
      iVar10 = iVar20;
    } while (iVar7 != 6);
    pRVar19 = local_8d8;
    uVar8 = (uint)local_8e0 + 1;
    if ((0xa8 < (uint)local_8e0) || (bVar13)) break;
    iVar10 = iVar10 + 1;
    local_8e0 = (ulong)uVar8;
  } while ((int)local_96c < 0x200);
  prog->asicLatencies[4] = 0;
  prog->asicLatencies[5] = 0;
  prog->asicLatencies[6] = 0;
  prog->asicLatencies[7] = 0;
  prog->asicLatencies[0] = 0;
  prog->asicLatencies[1] = 0;
  prog->asicLatencies[2] = 0;
  prog->asicLatencies[3] = 0;
  if (0 < (int)local_96c) {
    uVar15 = 0;
    do {
      bVar1 = prog->programBuffer[uVar15].dst;
      bVar2 = prog->programBuffer[uVar15].src;
      iVar10 = 0;
      if (bVar1 != bVar2) {
        iVar10 = prog->asicLatencies[bVar2] + 1;
      }
      iVar17 = prog->asicLatencies[bVar1] + 1;
      if (iVar17 <= iVar10) {
        iVar17 = iVar10;
      }
      prog->asicLatencies[bVar1] = iVar17;
      uVar15 = uVar15 + 1;
    } while (local_96c != uVar15);
  }
  uVar16 = 0;
  uVar15 = 0;
  iVar10 = 0;
  do {
    if (iVar10 < prog->asicLatencies[uVar16]) {
      uVar15 = uVar16 & 0xffffffff;
      iVar10 = prog->asicLatencies[uVar16];
    }
    prog->cpuLatencies[uVar16] = pRVar19->latency;
    uVar16 = uVar16 + 1;
    pRVar19 = pRVar19 + 1;
  } while (uVar16 != 8);
  prog->size = local_96c;
  prog->addrReg = (int)uVar15;
  prog->cpuLatency = local_930;
  prog->asicLatency = iVar10;
  prog->codeSize = local_944;
  prog->macroOps = local_92c;
  prog->decodeCycles = uVar8;
  prog->ipc = (double)local_92c / (double)local_930;
  prog->mulCount = local_948;
  return;
}

Assistant:

void generateSuperscalar(SuperscalarProgram& prog, Blake2Generator& gen) {

		ExecutionPort::type portBusy[CYCLE_MAP_SIZE][3];
		memset(portBusy, 0, sizeof(portBusy));
		RegisterInfo registers[8];

		const DecoderBuffer* decodeBuffer = &DecoderBuffer::Default;
		SuperscalarInstruction currentInstruction = SuperscalarInstruction::Null;
		int macroOpIndex = 0;
		int codeSize = 0;
		int macroOpCount = 0;
		int cycle = 0;
		int depCycle = 0;
		int retireCycle = 0;
		bool portsSaturated = false;
		int programSize = 0;
		int mulCount = 0;
		int decodeCycle;
		int throwAwayCount = 0;

		//decode instructions for RANDOMX_SUPERSCALAR_LATENCY cycles or until an execution port is saturated.
		//Each decode cycle decodes 16 bytes of x86 code.
		//Since a decode cycle produces on average 3.45 macro-ops and there are only 3 ALU ports, execution ports are always
		//saturated first. The cycle limit is present only to guarantee loop termination.
		//Program size is limited to SuperscalarMaxSize instructions.
		for (decodeCycle = 0; decodeCycle < RANDOMX_SUPERSCALAR_LATENCY && !portsSaturated && programSize < SuperscalarMaxSize; ++decodeCycle) {

			//select a decode configuration
			decodeBuffer = decodeBuffer->fetchNext(currentInstruction.getType(), decodeCycle, mulCount, gen);
			if (trace) std::cout << "; ------------- fetch cycle " << cycle << " (" << decodeBuffer->getName() << ")" << std::endl;

			int bufferIndex = 0;
			
			//fill all instruction slots in the current decode buffer
			while (bufferIndex < decodeBuffer->getSize()) {
				int topCycle = cycle;

				//if we have issued all macro-ops for the current DefyX instruction, create a new instruction
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					if (portsSaturated || programSize >= SuperscalarMaxSize)
						break;
					//select an instruction so that the first macro-op fits into the current slot
					currentInstruction.createForSlot(gen, decodeBuffer->getCounts()[bufferIndex], decodeBuffer->getIndex(), decodeBuffer->getSize() == bufferIndex + 1, bufferIndex == 0);
					macroOpIndex = 0;
					if (trace) std::cout << "; " << currentInstruction.getInfo().getName() << std::endl;
				}
				const MacroOp& mop = currentInstruction.getInfo().getOp(macroOpIndex);
				if (trace) std::cout << mop.getName() << " ";

				//calculate the earliest cycle when this macro-op (all of its uOPs) can be scheduled for execution
				int scheduleCycle = scheduleMop<false>(mop, portBusy, cycle, depCycle);
				if (scheduleCycle < 0) {
					if (trace) std::cout << "Unable to map operation '" << mop.getName() << "' to execution port (cycle " << cycle << ")" << std::endl;
					//__debugbreak();
					portsSaturated = true;
					break;
				}

				//find a source register (if applicable) that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getSrcOp()) {
					int forward;
					//if no suitable operand is ready, look up to LOOK_FORWARD_CYCLES forward
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectSource(scheduleCycle, registers, gen); ++forward) {
						if (trace) std::cout << "; src STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					//if no register was found, throw the instruction away and try another one
					if (forward == LOOK_FORWARD_CYCLES) {
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - source registers not available for operation " << currentInstruction.getInfo().getName() << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; src = r" << currentInstruction.getSource() << std::endl;
				}
				//find a destination register that will be ready when this instruction executes
				if (macroOpIndex == currentInstruction.getInfo().getDstOp()) {
					int forward;
					for (forward = 0; forward < LOOK_FORWARD_CYCLES && !currentInstruction.selectDestination(scheduleCycle, throwAwayCount > 0, registers, gen); ++forward) {
						if (trace) std::cout << "; dst STALL at cycle " << cycle << std::endl;
						++scheduleCycle;
						++cycle;
					}
					if (forward == LOOK_FORWARD_CYCLES) { //throw instruction away
						if (throwAwayCount < MAX_THROWAWAY_COUNT) {
							throwAwayCount++;
							macroOpIndex = currentInstruction.getInfo().getSize();
							if (trace) std::cout << "; THROW away " << currentInstruction.getInfo().getName() << std::endl;
							//cycle = topCycle;
							continue;
						}
						//abort this decode buffer
						if (trace) std::cout << "Aborting at cycle " << cycle << " with decode buffer " << decodeBuffer->getName() << " - destination registers not available" << std::endl;
						currentInstruction = SuperscalarInstruction::Null;
						break;
					}
					if (trace) std::cout << "; dst = r" << currentInstruction.getDestination() << std::endl;
				}
				throwAwayCount = 0;

				//recalculate when the instruction can be scheduled for execution based on operand availability
				scheduleCycle = scheduleMop<true>(mop, portBusy, scheduleCycle, scheduleCycle);

				//calculate when the result will be ready
				depCycle = scheduleCycle + mop.getLatency();

				//if this instruction writes the result, modify register information
				//  RegisterInfo.latency - which cycle the register will be ready
				//  RegisterInfo.lastOpGroup - the last operation that was applied to the register
				//  RegisterInfo.lastOpPar - the last operation source value (-1 = constant, 0-7 = register)
				if (macroOpIndex == currentInstruction.getInfo().getResultOp()) {
					int dst = currentInstruction.getDestination();
					RegisterInfo& ri = registers[dst];
					retireCycle = depCycle;
					ri.latency = retireCycle;
					ri.lastOpGroup = currentInstruction.getGroup();
					ri.lastOpPar = currentInstruction.getGroupPar();
					if (trace) std::cout << "; RETIRED at cycle " << retireCycle << std::endl;
				}
				codeSize += mop.getSize();
				bufferIndex++;
				macroOpIndex++;
				macroOpCount++;

				//terminating condition
				if (scheduleCycle >= RANDOMX_SUPERSCALAR_LATENCY) {
					portsSaturated = true;
				}
				cycle = topCycle;

				//when all macro-ops of the current instruction have been issued, add the instruction into the program
				if (macroOpIndex >= currentInstruction.getInfo().getSize()) {
					currentInstruction.toInstr(prog(programSize++));
					mulCount += isMultiplication(currentInstruction.getType());
				}
			}
			++cycle;
		}

		double ipc = (macroOpCount / (double)retireCycle);

		memset(prog.asicLatencies, 0, sizeof(prog.asicLatencies));

		//Calculate ASIC latency:
		//Assumes 1 cycle latency for all operations and unlimited parallelization.
		for (int i = 0; i < programSize; ++i) {
			Instruction& instr = prog(i);
			int latDst = prog.asicLatencies[instr.dst] + 1;
			int latSrc = instr.dst != instr.src ? prog.asicLatencies[instr.src] + 1 : 0;
			prog.asicLatencies[instr.dst] = std::max(latDst, latSrc);
		}

		//address register is the register with the highest ASIC latency
		int asicLatencyMax = 0;
		int addressReg = 0;
		for (int i = 0; i < 8; ++i) {
			if (prog.asicLatencies[i] > asicLatencyMax) {
				asicLatencyMax = prog.asicLatencies[i];
				addressReg = i;
			}
			prog.cpuLatencies[i] = registers[i].latency;
		}

		prog.setSize(programSize);
		prog.setAddressRegister(addressReg);

		prog.cpuLatency = retireCycle;
		prog.asicLatency = asicLatencyMax;
		prog.codeSize = codeSize;
		prog.macroOps = macroOpCount;
		prog.decodeCycles = decodeCycle;
		prog.ipc = ipc;
		prog.mulCount = mulCount;
		

		/*if(INFO) std::cout << "; ALU port utilization:" << std::endl;
		if (INFO) std::cout << "; (* = in use, _ = idle)" << std::endl;

		int portCycles = 0;
		for (int i = 0; i < CYCLE_MAP_SIZE; ++i) {
			std::cout << "; " << std::setw(3) << i << " ";
			for (int j = 0; j < 3; ++j) {
				std::cout << (portBusy[i][j] ? '*' : '_');
				portCycles += !!portBusy[i][j];
			}
			std::cout << std::endl;
		}*/
	}